

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  if (((pA != (ExprList *)0x0 || pB != (ExprList *)0x0) &&
      (iVar1 = 1, pA != (ExprList *)0x0 && pB != (ExprList *)0x0)) && (pA->nExpr == pB->nExpr)) {
    lVar3 = -1;
    lVar2 = 0x18;
    do {
      lVar3 = lVar3 + 1;
      if (pA->nExpr <= lVar3) {
        return 0;
      }
      if (*(char *)((long)pA->a + lVar2 + -8) != *(char *)((long)pB->a + lVar2 + -8)) {
        return 1;
      }
      iVar1 = sqlite3ExprCompare((Parse *)0x0,*(Expr **)((long)(pA->a + -1) + lVar2),
                                 *(Expr **)((long)(pB->a + -1) + lVar2),iTab);
      lVar2 = lVar2 + 0x18;
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(const ExprList *pA, const ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    int res;
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].fg.sortFlags!=pB->a[i].fg.sortFlags ) return 1;
    if( (res = sqlite3ExprCompare(0, pExprA, pExprB, iTab)) ) return res;
  }
  return 0;
}